

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O2

BasisCodec __thiscall
ktx::OptionsEncodeBasis<true>::validateBasisCodec
          (OptionsEncodeBasis<true> *this,OptionValue *codecOpt)

{
  BasisCodec BVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_iterator cVar4;
  long lVar5;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  BasisCodec local_88 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
  local_58;
  string local_30;
  
  if (validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_)
    ;
    if (iVar2 != 0) {
      local_88[1] = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
      ::pair<const_char_(&)[9],_ktx::BasisCodec,_true>
                (&local_80,(char (*) [9])"basis-lz",local_88 + 1);
      local_88[0] = UASTC;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
      ::pair<const_char_(&)[6],_ktx::BasisCodec,_true>(&local_58,(char (*) [6])0x1d6006,local_88);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx::BasisCodec>,std::allocator<std::pair<std::__cxx11::string_const,ktx::BasisCodec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,ktx::BasisCodec>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx::BasisCodec>,std::allocator<std::pair<std::__cxx11::string_const,ktx::BasisCodec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_,&local_80,
                 &local_30,0,&local_89,&local_8a,&local_8b);
      lVar5 = 0x28;
      do {
        std::__cxx11::string::~string((string *)((long)&local_80.first._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != -0x28);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
                   ::~unordered_map,
                   &validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_);
    }
  }
  if (codecOpt->m_count == 0) {
    BVar1 = NONE;
  }
  else {
    pbVar3 = cxxopts::OptionValue::as<std::__cxx11::string>(codecOpt);
    std::__cxx11::string::string((string *)&local_30,(string *)pbVar3);
    to_lower_copy(&local_80.first,&local_30);
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_._M_h,
                   &local_80.first);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_30);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_true>
        ._M_cur == (__node_type *)0x0) {
      BVar1 = INVALID;
    }
    else {
      BVar1 = *(BasisCodec *)
               ((long)cVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_true>
                      ._M_cur + 0x28);
    }
  }
  return BVar1;
}

Assistant:

BasisCodec validateBasisCodec(const cxxopts::OptionValue& codecOpt) const {
        static const std::unordered_map<std::string, BasisCodec> codecs = {
            { "basis-lz", BasisCodec::BasisLZ },
            { "uastc", BasisCodec::UASTC }
        };
        if (codecOpt.count()) {
            auto it = codecs.find(to_lower_copy(codecOpt.as<std::string>()));
            if (it != codecs.end()) {
                return it->second;
            } else {
                return BasisCodec::INVALID;
            }
        } else {
            return BasisCodec::NONE;
        }
    }